

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

string * __thiscall
cfd::core::ExtPrivkey::ToString_abi_cxx11_(string *__return_storage_ptr__,ExtPrivkey *this)

{
  allocator local_39;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,"ExtPrivkey",&local_39);
  ToBase58String(__return_storage_ptr__,&this->serialize_data_,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtPrivkey::ToString() const {
  return ToBase58String(serialize_data_, "ExtPrivkey");
}